

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

Vector3f pbrt::EqualAreaSquareToSphere(Point2f p)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float __x;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector3f VVar14;
  float local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = p.super_Tuple2<pbrt::Point2,_float>;
  if ((0.0 <= p.super_Tuple2<pbrt::Point2,_float>.x) &&
     (p.super_Tuple2<pbrt::Point2,_float>.x <= 1.0)) {
    auVar12 = vmovshdup_avx(auVar8._0_16_);
    if ((0.0 <= auVar12._0_4_) && (auVar12._0_4_ <= 1.0)) {
      auVar4._8_4_ = 0x40000000;
      auVar4._0_8_ = 0x4000000040000000;
      auVar4._12_4_ = 0x40000000;
      auVar12._8_4_ = 0xbf800000;
      auVar12._0_8_ = 0xbf800000bf800000;
      auVar12._12_4_ = 0xbf800000;
      auVar3 = vfmadd213ps_avx512vl(auVar4,auVar8._0_16_,auVar12);
      auVar11._8_4_ = 0x7fffffff;
      auVar11._0_8_ = 0x7fffffff7fffffff;
      auVar11._12_4_ = 0x7fffffff;
      auVar12 = vandps_avx(auVar3,auVar11);
      auVar7 = vshufps_avx(auVar12,auVar12,0xf5);
      auVar13 = ZEXT416((uint)(1.0 - (auVar12._0_4_ + auVar7._0_4_)));
      auVar4 = vandps_avx(auVar13,auVar11);
      fVar1 = 1.0 - auVar4._0_4_;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        fVar6 = ((auVar7._0_4_ - auVar12._0_4_) / fVar1 + 1.0) * 3.1415927 * 0.25;
      }
      else {
        fVar6 = 0.7853982;
      }
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar4 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)(1.0 - fVar1 * fVar1)),auVar7,0xd8);
      fVar5 = cosf(fVar6);
      fVar6 = sinf(fVar6);
      auVar12 = vmaxss_avx(ZEXT416((uint)(2.0 - fVar1 * fVar1)),ZEXT816(0) << 0x40);
      __x = auVar12._0_4_;
      if (__x < 0.0) {
        auVar9._0_4_ = sqrtf(__x);
        auVar9._4_60_ = extraout_var;
        auVar12 = ZEXT416((uint)__x);
        auVar7 = auVar9._0_16_;
      }
      else {
        auVar7 = vsqrtss_avx(auVar12,auVar12);
      }
      if (auVar12._0_4_ < 0.0) {
        auVar10._0_4_ = sqrtf(auVar12._0_4_);
        auVar10._4_60_ = extraout_var_00;
        auVar12 = auVar10._0_16_;
      }
      else {
        auVar12 = vsqrtss_avx(auVar12,auVar12);
      }
      local_48 = auVar4._0_4_;
      auVar12 = vinsertps_avx(auVar7,auVar12,0x10);
      auVar2._4_4_ = extraout_XMM0_Db;
      auVar2._0_4_ = fVar5;
      auVar2._8_4_ = extraout_XMM0_Dc;
      auVar2._12_4_ = extraout_XMM0_Dd;
      auVar4 = vinsertps_avx(auVar2,ZEXT416((uint)fVar6),0x10);
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar4 = vpternlogd_avx512vl(auVar3,auVar4,auVar13,0xd8);
      VVar14.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * auVar4._0_4_ * auVar12._0_4_;
      VVar14.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * auVar4._4_4_ * auVar12._4_4_;
      VVar14.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
      return (Vector3f)VVar14.super_Tuple3<pbrt::Vector3,_float>;
    }
  }
  LogFatal<char_const(&)[45]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.cpp"
             ,0x125,"Check failed: %s",(char (*) [45])"p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1"
            );
}

Assistant:

Vector3f EqualAreaSquareToSphere(Point2f p) {
    CHECK(p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1);
    // Transform _p_ to $[-1,1]^2$ and compute absolute values
    Float u = 2 * p.x - 1, v = 2 * p.y - 1;
    Float up = std::abs(u), vp = std::abs(v);

    // Compute radius _r_ as signed distance from diagonal
    Float signedDistance = 1 - (up + vp);
    Float d = std::abs(signedDistance);
    Float r = 1 - d;

    // Compute angle $\phi$ for square to sphere mapping
    Float phi = (r == 0 ? 1 : (vp - up) / r + 1) * Pi / 4;

    // Find $z$ coordinate for spherical direction
    Float z = std::copysign(1 - Sqr(r), signedDistance);

    // Compute $\cos \phi$ and $\sin \phi$ for original quadrant and return vector
    Float cosPhi = std::copysign(std::cos(phi), u);
    Float sinPhi = std::copysign(std::sin(phi), v);
    return Vector3f(cosPhi * r * SafeSqrt(2 - Sqr(r)), sinPhi * r * SafeSqrt(2 - Sqr(r)),
                    z);
}